

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_store_aux(REF_NODE ref_node,REF_INT ldim,REF_DBL *aux)

{
  uint uVar1;
  REF_DBL *pRVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  REF_STATUS RVar9;
  
  ref_node->naux = ldim;
  uVar8 = ldim;
  if (ref_node->aux != (REF_DBL *)0x0) {
    free(ref_node->aux);
    ref_node->aux = (REF_DBL *)0x0;
    uVar8 = ref_node->naux;
  }
  uVar1 = ref_node->max;
  if ((int)(uVar1 * uVar8) < 0) {
    RVar9 = 1;
    pcVar6 = "malloc ref_node->aux of REF_DBL negative";
  }
  else {
    pRVar2 = (REF_DBL *)malloc((ulong)(uVar1 * uVar8) << 3);
    ref_node->aux = pRVar2;
    if (pRVar2 != (REF_DBL *)0x0) {
      uVar3 = 0;
      if (0 < (int)uVar8) {
        uVar3 = (ulong)uVar8;
      }
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar7 = 0;
      }
      for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
        if (-1 < ref_node->global[uVar4]) {
          for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
            pRVar2[uVar5] = aux[uVar5];
          }
        }
        pRVar2 = pRVar2 + (int)uVar8;
        aux = aux + ldim;
      }
      return 0;
    }
    RVar9 = 2;
    pcVar6 = "malloc ref_node->aux of REF_DBL NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa8a,
         "ref_node_store_aux",pcVar6);
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_node_store_aux(REF_NODE ref_node, REF_INT ldim,
                                      REF_DBL *aux) {
  REF_INT iaux, node;
  ref_node_naux(ref_node) = ldim;
  if (NULL != ref_node->aux) {
    ref_free(ref_node->aux);
    ref_node->aux = NULL;
  }
  ref_malloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
             REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (iaux = 0; iaux < ref_node_naux(ref_node); iaux++) {
      ref_node_aux(ref_node, iaux, node) = aux[iaux + ldim * node];
    }
  }
  return REF_SUCCESS;
}